

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentSelector.hpp
# Opt level: O2

Status __thiscall
AO::BehaviorTree::Version_1::Details::ConcurrentSelector<Agent,_short>::execute
          (ConcurrentSelector<Agent,_short> *this,EntityPtr entity,short args)

{
  ChildrenStatusMap *this_00;
  FailurePolicy FVar1;
  SuccessPolicy SVar2;
  pointer psVar3;
  element_type *peVar4;
  byte bVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  mapped_type *pmVar9;
  __node_base *p_Var10;
  Status SVar11;
  bool bVar12;
  pointer __k;
  
  if ((this->childrenStatus)._M_h._M_element_count == 0) {
    initialize(this,entity);
  }
  this_00 = &this->childrenStatus;
  psVar3 = (this->super_CompositeNode<Agent,_short>).children.
           super__Vector_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (__k = (this->super_CompositeNode<Agent,_short>).children.
             super__Vector_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::allocator<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; __k != psVar3; __k = __k + 1) {
    pmVar9 = std::__detail::
             _Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,__k);
    if (*pmVar9 == Running) {
      peVar4 = (__k->
               super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      uVar7 = (*(peVar4->super_RootNode<Agent,_short>)._vptr_RootNode[3])
                        (peVar4,entity,(ulong)(uint)(int)args);
      if ((mapped_type)uVar7 != Success) {
        if ((uVar7 & 0xff) != 1) goto LAB_00122f4a;
        if (this->failPolicy == FailOnOne) {
          SVar11 = Failure;
          goto LAB_00123033;
        }
      }
      pmVar9 = std::__detail::
               _Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,__k);
      *pmVar9 = (mapped_type)uVar7;
    }
LAB_00122f4a:
    pmVar9 = std::__detail::
             _Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,__k);
    if ((*pmVar9 == Failure) && (this->failPolicy == FailOnAll)) {
      peVar4 = (__k->
               super___shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      iVar8 = (*(peVar4->super_RootNode<Agent,_short>)._vptr_RootNode[3])
                        (peVar4,entity,(ulong)(uint)(int)args);
      pmVar9 = std::__detail::
               _Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>,_std::allocator<std::pair<const_std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>,_AO::BehaviorTree::Version_1::Details::Status>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::hash<std::shared_ptr<AO::BehaviorTree::Version_1::Details::LeafNode<Agent,_short>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,__k);
      *pmVar9 = (mapped_type)iVar8;
    }
  }
  p_Var10 = &(this->childrenStatus)._M_h._M_before_begin;
  FVar1 = this->failPolicy;
  SVar2 = this->succeedPolicy;
  bVar5 = 1;
  bVar6 = false;
  bVar12 = true;
  do {
    while( true ) {
      while( true ) {
        p_Var10 = p_Var10->_M_nxt;
        if (p_Var10 == (__node_base *)0x0) {
          SVar11 = Failure;
          if (!(bool)(FVar1 == FailOnAll & bVar5)) {
            if ((SVar2 != SuccessOnOne) && (bVar6 = bVar12, SVar2 != SuccessOnAll)) {
              return Running;
            }
            if (!bVar6) {
              return Running;
            }
            SVar11 = Success;
          }
          goto LAB_00123033;
        }
        SVar11 = (Status)*(size_t *)(p_Var10 + 3);
        if (SVar11 != Running) break;
        bVar5 = 0;
        bVar12 = false;
        if (SVar2 == SuccessOnAll && FVar1 == FailOnAll) {
          return Running;
        }
      }
      if (SVar11 == Failure) break;
      if (SVar11 == Success) {
        bVar6 = true;
        bVar5 = 0;
        if (SVar2 == SuccessOnOne && FVar1 != FailOnOne) goto LAB_00123033;
      }
    }
    bVar12 = false;
  } while (FVar1 != FailOnOne);
LAB_00123033:
  initialize(this,entity);
  return SVar11;
}

Assistant:

Status execute(EntityPtr entity, Args... args) override final
					{
						if (childrenStatus.empty())
						{
							initialize(entity);
						}
						for (auto &child : this->children)
						{
							if (childrenStatus[child] == Status::Running)
							{
								Status const status = child->execute(entity, args...);
								if (status == Status::Failure)
								{
									if (failPolicy == FailurePolicy::FailOnOne)
									{
										initialize(entity);
										return Status::Failure;
									}
									else
									{
										childrenStatus[child] = Status::Failure;
									}
								}
								else if (status == Status::Success)
								{
									childrenStatus[child] = Status::Success;
								}
							}
							if (childrenStatus[child] == Status::Failure && failPolicy == FailurePolicy::FailOnAll)
							{
								childrenStatus[child] = child->execute(entity, args...);
							}
						}
						bool sawSuccess = false;
						bool sawAllFails = true;
						bool sawAllSuccess = true;
						for (auto &pair : childrenStatus)
						{
							switch (pair.second)
							{
							case Status::Success:
								if (succeedPolicy == SuccessPolicy::SuccessOnOne && failPolicy != FailurePolicy::FailOnOne)
								{
									initialize(entity);
									return Status::Success;
								}
								else
								{
									sawSuccess = true;
									sawAllFails = false;
								}
								break;
							case Status::Failure:
								if (failPolicy == FailurePolicy::FailOnOne)
								{
									initialize(entity);
									return Status::Failure;
								}
								else
								{
									sawAllSuccess = false;
								}
								break;
							case Status::Running:
								if (failPolicy == FailurePolicy::FailOnAll && succeedPolicy == SuccessPolicy::SuccessOnAll)
								{
									return Status::Running;
								}
								sawAllFails = false;
								sawAllSuccess = false;
								break;
							default:
								break;
							}
						}
						if (failPolicy == FailurePolicy::FailOnAll && sawAllFails)
						{
							initialize(entity);
							return Status::Failure;
						}
						else if ((succeedPolicy == SuccessPolicy::SuccessOnAll && sawAllSuccess) || (succeedPolicy == SuccessPolicy::SuccessOnOne && sawSuccess))
						{
							initialize(entity);
							return Status::Success;
						}
						else
						{
							return Status::Running;
						}
					}